

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention::forward_int8
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint _h_00;
  Mat *blob;
  Mat *this_00;
  size_t sVar1;
  int j;
  uint _w;
  uint _w_00;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  void *pvVar18;
  Mat *pMVar19;
  ulong uVar20;
  long lVar21;
  void *pvVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float xkm_int8_scale;
  float v_blob_int8_scale;
  float k_blob_int8_scale;
  float q_blob_int8_scale;
  Mat m;
  Mat m_1;
  long local_4f0;
  long local_4e8;
  ulong local_4e0;
  void *local_4d0;
  float local_4c0;
  float local_4bc;
  float local_4b8;
  float local_4b4;
  int *local_4b0;
  Mat local_4a8;
  long *local_458;
  long local_450;
  Mat *local_448;
  int local_43c;
  Mat local_438;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  Mat local_3d8;
  long local_388;
  void *local_380;
  Mat local_378;
  Mat local_328;
  Mat local_2d8;
  Mat local_288;
  int *local_240;
  Mat local_238;
  Mat local_1e8;
  Mat local_198;
  Mat local_148;
  Mat local_f8;
  Mat local_a8;
  Mat *local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  long local_38;
  
  blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start;
  lVar4 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)blob;
  local_448 = blob;
  pMVar19 = blob;
  if (lVar4 == 0x48) {
    iVar2 = this->attn_mask;
LAB_005179c5:
    if (iVar2 == 0) {
      local_4d0 = (void *)0x0;
      local_4b0 = (int *)0x0;
      local_4f0 = 0;
      local_458 = (long *)0x0;
      local_43c = 0;
      iVar2 = 0;
      local_3e0 = 0;
      goto LAB_00517a9c;
    }
  }
  else {
    iVar2 = this->attn_mask;
    if (iVar2 == 0 || lVar4 != 0x90) {
      pMVar19 = blob + 1;
      local_448 = pMVar19;
      if (iVar2 == 0) {
        local_448 = blob + 2;
      }
      if (lVar4 != 0xd8) {
        local_448 = blob + 2;
      }
      if (lVar4 == 0x90) {
        local_448 = pMVar19;
      }
      goto LAB_005179c5;
    }
  }
  local_4d0 = *(void **)((long)blob + lVar4 + -0x48);
  local_4b0 = *(int **)((long)blob + lVar4 + -0x40);
  local_4f0 = *(long *)((long)blob + lVar4 + -0x38);
  local_458 = *(long **)((long)blob + lVar4 + -0x28);
  local_43c = *(int *)((long)blob + lVar4 + -0x20);
  iVar2 = *(int *)((long)blob + lVar4 + -0x1c);
  local_3e0 = *(long *)((long)blob + lVar4 + -8);
  if (local_4b0 == (int *)0x0) {
    local_4b0 = (int *)0x0;
  }
  else {
    LOCK();
    *local_4b0 = *local_4b0 + 1;
    UNLOCK();
  }
LAB_00517a9c:
  local_240 = &this->attn_mask;
  _h = blob->h;
  uVar17 = (ulong)_h;
  _h_00 = pMVar19->h;
  uVar7 = (ulong)_h_00;
  _w = this->embed_dim / this->num_heads;
  _w_00 = this->weight_data_size / this->embed_dim;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,_w_00,_h,4,opt->blob_allocator);
  iVar15 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    Mat::create(&local_f8,_w,_h,this->num_heads,4,opt->workspace_allocator);
    iVar15 = -100;
    if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      Mat::create(&local_a8,_w,_h_00,this->num_heads,4,opt->workspace_allocator);
      iVar15 = -100;
      if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
        local_148.cstep = 0;
        local_148.data = (void *)0x0;
        local_148.refcount._0_4_ = 0;
        local_148.refcount._4_4_ = 0;
        local_148.elemsize._0_4_ = 0;
        local_148.elemsize._4_4_ = 0;
        local_148.elempack = 0;
        local_148.allocator = (Allocator *)0x0;
        local_148.dims = 0;
        local_148.w = 0;
        local_148.h = 0;
        local_148.d = 0;
        local_148.c = 0;
        Mat::create(&local_148,_h_00,_w,this->num_heads,4,opt->workspace_allocator);
        iVar15 = -100;
        if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
          local_328.cstep = 0;
          local_328.data = (void *)0x0;
          local_328.refcount._0_4_ = 0;
          local_328.refcount._4_4_ = 0;
          local_328.elemsize._0_4_ = 0;
          local_328.elemsize._4_4_ = 0;
          local_328.elempack = 0;
          local_328.allocator = (Allocator *)0x0;
          local_328.dims = 0;
          local_328.w = 0;
          local_328.h = 0;
          local_328.d = 0;
          local_328.c = 0;
          Mat::create(&local_328,_h_00,_h,this->num_heads,4,opt->workspace_allocator);
          iVar15 = -100;
          if ((local_328.data != (void *)0x0) && ((long)local_328.c * local_328.cstep != 0)) {
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize._0_4_ = 0;
            local_198.elemsize._4_4_ = 0;
            local_198.elempack = 0;
            local_198.allocator = (Allocator *)0x0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
            Mat::create(&local_198,_w,this->num_heads,_h,4,opt->workspace_allocator);
            iVar15 = -100;
            if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
              local_238.cstep = 0;
              local_238.data = (void *)0x0;
              local_238.refcount._0_4_ = 0;
              local_238.refcount._4_4_ = 0;
              local_238.elemsize._0_4_ = 0;
              local_238.elemsize._4_4_ = 0;
              local_238.elempack = 0;
              local_238.allocator = (Allocator *)0x0;
              local_238.dims = 0;
              local_238.w = 0;
              local_238.h = 0;
              local_238.d = 0;
              local_238.c = 0;
              dynamic_quantize_2d(blob,&local_238,&local_4b4,(Option *)opt->workspace_allocator);
              local_378.cstep = 0;
              local_378.data = (void *)0x0;
              local_378.refcount._0_4_ = 0;
              local_378.refcount._4_4_ = 0;
              local_378.elemsize._0_4_ = 0;
              local_378.elemsize._4_4_ = 0;
              local_378.elempack = 0;
              local_378.allocator = (Allocator *)0x0;
              local_378.dims = 0;
              local_378.w = 0;
              local_378.h = 0;
              local_378.d = 0;
              local_378.c = 0;
              if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start == 0x48) {
                piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                local_378.data = local_238.data;
                local_378.refcount._0_4_ = local_238.refcount._0_4_;
                local_378.refcount._4_4_ = local_238.refcount._4_4_;
                local_378.elemsize._0_4_ = (undefined4)local_238.elemsize;
                local_378.elemsize._4_4_ = local_238.elemsize._4_4_;
                local_378.elempack = local_238.elempack;
                local_378.allocator = local_238.allocator;
                local_378.dims = local_238.dims;
                local_378.w = local_238.w;
                local_378.h = local_238.h;
                local_378.d = local_238.d;
                local_378.c = local_238.c;
                local_378.cstep = local_238.cstep;
                local_4b8 = local_4b4;
              }
              else {
                dynamic_quantize_2d(pMVar19,&local_378,&local_4b8,(Option *)opt->workspace_allocator
                                   );
              }
              local_3d8.cstep = 0;
              local_3d8.data = (void *)0x0;
              local_3d8.refcount._0_4_ = 0;
              local_3d8.refcount._4_4_ = 0;
              local_3d8.elemsize._0_4_ = 0;
              local_3d8.elemsize._4_4_ = 0;
              local_3d8.elempack = 0;
              local_3d8.allocator = (Allocator *)0x0;
              local_3d8.dims = 0;
              local_3d8.w = 0;
              local_3d8.h = 0;
              local_3d8.d = 0;
              local_3d8.c = 0;
              lVar4 = ((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
              if (lVar4 == 2) {
                piVar5 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                local_3d8.data = local_378.data;
                local_3d8.refcount._0_4_ = local_378.refcount._0_4_;
                local_3d8.refcount._4_4_ = local_378.refcount._4_4_;
                local_3d8.elemsize._0_4_ = (undefined4)local_378.elemsize;
                local_3d8.elemsize._4_4_ = local_378.elemsize._4_4_;
                local_3d8.elempack = local_378.elempack;
                local_3d8.allocator = local_378.allocator;
                local_3d8.dims = local_378.dims;
                local_3d8.w = local_378.w;
                local_3d8.h = local_378.h;
                local_3d8.d = local_378.d;
                local_3d8.c = local_378.c;
                local_3d8.cstep = local_378.cstep;
                local_4bc = local_4b8;
              }
              else if (lVar4 == 1) {
                piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                local_3d8.data = local_238.data;
                local_3d8.refcount._0_4_ = local_238.refcount._0_4_;
                local_3d8.refcount._4_4_ = local_238.refcount._4_4_;
                local_3d8.elemsize._0_4_ = (undefined4)local_238.elemsize;
                local_3d8.elemsize._4_4_ = local_238.elemsize._4_4_;
                local_3d8.elempack = local_238.elempack;
                local_3d8.allocator = local_238.allocator;
                local_3d8.dims = local_238.dims;
                local_3d8.w = local_238.w;
                local_3d8.h = local_238.h;
                local_3d8.d = local_238.d;
                local_3d8.c = local_238.c;
                local_3d8.cstep = local_238.cstep;
                local_4bc = local_4b4;
              }
              else {
                dynamic_quantize_2d(local_448,&local_3d8,&local_4bc,
                                    (Option *)opt->workspace_allocator);
              }
              local_60 = this_00;
              if (0 < this->num_heads) {
                local_3e0 = local_3e0 * local_4f0;
                local_448 = (Mat *)(long)(int)_w_00;
                local_3f0 = (long)(int)_w;
                uVar16 = (ulong)_w;
                local_58 = local_3f0 * (long)local_448;
                local_50 = iVar2 * local_4f0;
                local_3e8 = 0;
                local_388 = 0;
                local_4e8 = 0;
                do {
                  pvVar22 = local_328.data;
                  if (0 < (int)_h) {
                    pvVar10 = (this->q_bias_data).data;
                    pvVar18 = (this->q_weight_data_int8_scales).data;
                    local_450 = (long)(this->q_weight_data).data + local_388;
                    uVar20 = 0;
                    pvVar11 = local_238.data;
                    do {
                      if (0 < (int)_w) {
                        uVar8 = 0;
                        lVar4 = local_450;
                        do {
                          if ((int)_w_00 < 1) {
                            fVar24 = 0.0;
                          }
                          else {
                            lVar21 = 0;
                            iVar2 = 0;
                            do {
                              iVar2 = iVar2 + (int)*(char *)(lVar4 + lVar21) *
                                              (int)*(char *)((long)pvVar11 + lVar21);
                              lVar21 = lVar21 + 1;
                            } while (_w_00 != (uint)lVar21);
                            fVar24 = (float)iVar2;
                          }
                          lVar21 = uVar8 + local_4e8 * local_3f0;
                          *(float *)((long)local_f8.data +
                                    uVar8 * 4 +
                                    (long)local_f8.w *
                                    CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize)
                                    * uVar20 +
                                    local_f8.cstep * local_4e8 *
                                    CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize))
                               = (fVar24 / (*(float *)((long)pvVar18 + lVar21 * 4) * local_4b4) +
                                 *(float *)((long)pvVar10 + lVar21 * 4)) * this->scale;
                          uVar8 = uVar8 + 1;
                          lVar4 = (long)&local_448->data + lVar4;
                        } while (uVar8 != uVar16);
                      }
                      uVar20 = uVar20 + 1;
                      pvVar11 = (void *)((long)pvVar11 +
                                        (long)local_238.w *
                                        CONCAT44(local_238.elemsize._4_4_,
                                                 (undefined4)local_238.elemsize));
                    } while (uVar20 != uVar17);
                  }
                  if (0 < (long)local_378.h) {
                    pfVar9 = (float *)(local_a8.cstep * local_4e8 *
                                       CONCAT44(local_a8.elemsize._4_4_,
                                                (undefined4)local_a8.elemsize) + (long)local_a8.data
                                      );
                    iVar2 = this->kdim;
                    pvVar10 = (this->k_weight_data_int8_scales).data;
                    pvVar18 = (this->k_bias_data).data;
                    local_450 = (long)local_378.w *
                                CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
                    local_380 = (void *)(local_3e8 * iVar2 + (long)(this->k_weight_data).data);
                    lVar4 = 0;
                    pvVar11 = local_378.data;
                    do {
                      if (0 < (int)_w) {
                        uVar20 = 0;
                        pvVar12 = local_380;
                        do {
                          if (iVar2 < 1) {
                            fVar24 = 0.0;
                          }
                          else {
                            lVar21 = 0;
                            iVar15 = 0;
                            do {
                              iVar15 = iVar15 + (int)*(char *)((long)pvVar12 + lVar21) *
                                                (int)*(char *)((long)pvVar11 + lVar21);
                              lVar21 = lVar21 + 1;
                            } while (iVar2 != (int)lVar21);
                            fVar24 = (float)iVar15;
                          }
                          lVar21 = uVar20 + local_4e8 * local_3f0;
                          *pfVar9 = fVar24 / (local_4b8 * *(float *)((long)pvVar10 + lVar21 * 4)) +
                                    *(float *)((long)pvVar18 + lVar21 * 4);
                          pfVar9 = pfVar9 + 1;
                          uVar20 = uVar20 + 1;
                          pvVar12 = (void *)((long)pvVar12 + (long)iVar2);
                        } while (uVar20 != uVar16);
                      }
                      lVar4 = lVar4 + 1;
                      pvVar11 = (void *)((long)pvVar11 + local_450);
                    } while (lVar4 != local_378.h);
                  }
                  if (0 < (int)_w) {
                    local_380 = (void *)(local_148.cstep * local_4e8 *
                                         CONCAT44(local_148.elemsize._4_4_,
                                                  (undefined4)local_148.elemsize) +
                                        (long)local_148.data);
                    local_38 = (long)local_148.w *
                               CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                    local_40 = local_3d8.data;
                    iVar2 = this->vdim;
                    local_48 = local_4e8 * local_3f0;
                    pvVar10 = (this->v_weight_data_int8_scales).data;
                    local_450 = (long)iVar2;
                    pvVar11 = (void *)(local_3e8 * local_450 + (long)(this->v_weight_data).data);
                    pvVar18 = (this->v_bias_data).data;
                    local_4e0 = 0;
                    do {
                      if (0 < local_3d8.h) {
                        pfVar9 = (float *)(local_38 * local_4e0 + (long)local_380);
                        uVar20 = 0;
                        pvVar12 = local_3d8.data;
                        do {
                          if (iVar2 < 1) {
                            fVar24 = 0.0;
                          }
                          else {
                            lVar4 = 0;
                            iVar15 = 0;
                            do {
                              iVar15 = iVar15 + (int)*(char *)((long)pvVar11 + lVar4) *
                                                (int)*(char *)((long)pvVar12 + lVar4);
                              lVar4 = lVar4 + 1;
                            } while (iVar2 != (int)lVar4);
                            fVar24 = (float)iVar15;
                          }
                          *pfVar9 = fVar24 / (*(float *)((long)pvVar10 + (local_4e0 + local_48) * 4)
                                             * local_4bc) +
                                    *(float *)((long)pvVar18 + (local_4e0 + local_48) * 4);
                          pfVar9 = pfVar9 + 1;
                          uVar20 = uVar20 + 1;
                          pvVar12 = (void *)((long)pvVar12 +
                                            (long)local_3d8.w *
                                            CONCAT44(local_3d8.elemsize._4_4_,
                                                     (undefined4)local_3d8.elemsize));
                        } while (uVar20 != (uint)local_3d8.h);
                      }
                      local_4e0 = local_4e0 + 1;
                      pvVar11 = (void *)((long)pvVar11 + local_450);
                    } while (local_4e0 != uVar16);
                  }
                  uVar20 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                  local_4a8.data =
                       (void *)(local_f8.cstep * local_4e8 * uVar20 + (long)local_f8.data);
                  local_4a8.refcount._0_4_ = 0;
                  local_4a8.refcount._4_4_ = 0;
                  local_4a8.elemsize._0_4_ = (undefined4)local_f8.elemsize;
                  local_4a8.elemsize._4_4_ = local_f8.elemsize._4_4_;
                  local_4a8.elempack = local_f8.elempack;
                  local_4a8.allocator = local_f8.allocator;
                  local_4a8.w = local_f8.w;
                  local_4a8.h = local_f8.h;
                  local_4a8.c = local_f8.d;
                  local_4a8.d = 1;
                  local_4a8.dims = local_f8.dims + -1;
                  local_4a8.cstep =
                       (uVar20 * (long)local_f8.h * (long)local_f8.w + 0xf & 0xfffffffffffffff0) /
                       uVar20;
                  if (local_f8.dims == 4) {
                    local_4a8.cstep = (long)local_f8.h * (long)local_f8.w;
                  }
                  uVar20 = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                  local_438.data =
                       (void *)(local_a8.cstep * local_4e8 * uVar20 + (long)local_a8.data);
                  local_438.refcount._0_4_ = 0;
                  local_438.refcount._4_4_ = 0;
                  local_438.elemsize._0_4_ = (undefined4)local_a8.elemsize;
                  local_438.elemsize._4_4_ = local_a8.elemsize._4_4_;
                  local_438.elempack = local_a8.elempack;
                  local_438.allocator = local_a8.allocator;
                  local_438.w = local_a8.w;
                  local_438.h = local_a8.h;
                  local_438.c = local_a8.d;
                  local_438.d = 1;
                  local_438.dims = local_a8.dims + -1;
                  local_438.cstep =
                       (uVar20 * (long)local_a8.h * (long)local_a8.w + 0xf & 0xfffffffffffffff0) /
                       uVar20;
                  if (local_a8.dims == 4) {
                    local_438.cstep = (long)local_a8.h * (long)local_a8.w;
                  }
                  lVar13 = (long)local_328.w;
                  lVar21 = local_328.cstep * local_4e8;
                  lVar4 = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
                  local_288.cstep = 0;
                  local_288.data = (void *)0x0;
                  local_288.refcount._0_4_ = 0;
                  local_288.refcount._4_4_ = 0;
                  local_288.elemsize._0_4_ = 0;
                  local_288.elemsize._4_4_ = 0;
                  local_288.elempack = 0;
                  local_288.h = 0;
                  local_288.d = 0;
                  local_288.c = 0;
                  local_288.allocator = (Allocator *)0x0;
                  local_288.dims = 0;
                  local_288.w = 0;
                  local_1e8.cstep = 0;
                  local_1e8.data = (void *)0x0;
                  local_1e8.refcount._0_4_ = 0;
                  local_1e8.refcount._4_4_ = 0;
                  local_1e8.elemsize._0_4_ = 0;
                  local_1e8._20_8_ = 0;
                  local_1e8.h = 0;
                  local_1e8.d = 0;
                  local_1e8.c = 0;
                  local_1e8.allocator = (Allocator *)0x0;
                  local_1e8.dims = 0;
                  local_1e8.w = 0;
                  dynamic_quantize_2d_per_h(&local_4a8,&local_288,&local_1e8,opt);
                  local_2d8.cstep = 0;
                  local_2d8.data = (void *)0x0;
                  local_2d8.refcount._0_4_ = 0;
                  local_2d8.refcount._4_4_ = 0;
                  local_2d8.elemsize._0_4_ = 0;
                  local_2d8.elemsize._4_4_ = 0;
                  local_2d8.elempack = 0;
                  local_2d8.h = 0;
                  local_2d8.d = 0;
                  local_2d8.c = 0;
                  local_2d8.allocator = (Allocator *)0x0;
                  local_2d8.dims = 0;
                  local_2d8.w = 0;
                  dynamic_quantize_2d(&local_438,&local_2d8,&local_4c0,
                                      (Option *)opt->workspace_allocator);
                  if (0 < (int)_h) {
                    uVar20 = 0;
                    pvVar10 = local_288.data;
                    do {
                      if (0 < (int)_h_00) {
                        fVar24 = *(float *)((long)local_1e8.data + uVar20 * 4);
                        uVar8 = 0;
                        pvVar18 = local_2d8.data;
                        do {
                          if ((int)_w < 1) {
                            fVar25 = 0.0;
                          }
                          else {
                            lVar14 = 0;
                            iVar2 = 0;
                            do {
                              iVar2 = iVar2 + (int)*(char *)((long)pvVar18 + lVar14) *
                                              (int)*(char *)((long)pvVar10 + lVar14);
                              lVar14 = lVar14 + 1;
                            } while (_w != (uint)lVar14);
                            fVar25 = (float)iVar2;
                          }
                          *(float *)((long)pvVar22 +
                                    uVar8 * 4 + lVar4 * lVar13 * uVar20 + lVar21 * lVar4) =
                               fVar25 * (1.0 / (fVar24 * local_4c0));
                          uVar8 = uVar8 + 1;
                          pvVar18 = (void *)((long)pvVar18 +
                                            (long)local_2d8.w *
                                            CONCAT44(local_2d8.elemsize._4_4_,
                                                     (undefined4)local_2d8.elemsize));
                        } while (uVar8 != uVar7);
                      }
                      uVar20 = uVar20 + 1;
                      pvVar10 = (void *)((long)pvVar10 +
                                        (long)local_288.w *
                                        CONCAT44(local_288.elemsize._4_4_,
                                                 (undefined4)local_288.elemsize));
                    } while (uVar20 != uVar17);
                  }
                  piVar5 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_2d8.allocator == (Allocator *)0x0) {
                        if (local_2d8.data != (void *)0x0) {
                          free(local_2d8.data);
                        }
                      }
                      else {
                        (*(local_2d8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_1e8.allocator == (Allocator *)0x0) {
                        if (local_1e8.data != (void *)0x0) {
                          free(local_1e8.data);
                        }
                      }
                      else {
                        (*(local_1e8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_288.allocator == (Allocator *)0x0) {
                        if (local_288.data != (void *)0x0) {
                          free(local_288.data);
                        }
                      }
                      else {
                        (*(local_288.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_438.refcount._4_4_,local_438.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_438.allocator == (Allocator *)0x0) {
                        if (local_438.data != (void *)0x0) {
                          free(local_438.data);
                        }
                      }
                      else {
                        (*(local_438.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_4a8.allocator == (Allocator *)0x0) {
                        if (local_4a8.data != (void *)0x0) {
                          free(local_4a8.data);
                        }
                      }
                      else {
                        (*(local_4a8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (*local_240 != 0) {
                    if (local_43c == 3) {
                      piVar5 = (int *)0x0;
                      pvVar22 = (void *)(local_3e0 * local_4e8 + (long)local_4d0);
                    }
                    else {
                      pvVar22 = local_4d0;
                      if (local_4b0 == (int *)0x0) {
                        piVar5 = (int *)0x0;
                      }
                      else {
                        LOCK();
                        *local_4b0 = *local_4b0 + 1;
                        UNLOCK();
                        piVar5 = local_4b0;
                      }
                    }
                    if (0 < (int)_h) {
                      pvVar18 = (void *)(CONCAT44(local_328.elemsize._4_4_,
                                                  (undefined4)local_328.elemsize) * local_328.cstep
                                         * local_4e8 + (long)local_328.data);
                      uVar20 = 0;
                      pvVar10 = pvVar22;
                      do {
                        if (0 < (int)_h_00) {
                          uVar8 = 0;
                          do {
                            *(float *)((long)pvVar18 + uVar8 * 4) =
                                 *(float *)((long)pvVar18 + uVar8 * 4) +
                                 *(float *)((long)pvVar10 + uVar8 * 4);
                            uVar8 = uVar8 + 1;
                          } while (uVar7 != uVar8);
                        }
                        uVar20 = uVar20 + 1;
                        pvVar18 = (void *)((long)pvVar18 +
                                          (long)local_328.w *
                                          CONCAT44(local_328.elemsize._4_4_,
                                                   (undefined4)local_328.elemsize));
                        pvVar10 = (void *)((long)pvVar10 + local_50);
                      } while (uVar20 != uVar17);
                    }
                    if (piVar5 != (int *)0x0) {
                      LOCK();
                      *piVar5 = *piVar5 + -1;
                      UNLOCK();
                      if (*piVar5 == 0) {
                        if (local_458 == (long *)0x0) {
                          if (pvVar22 != (void *)0x0) {
                            free(pvVar22);
                          }
                        }
                        else {
                          (**(code **)(*local_458 + 0x18))();
                        }
                      }
                    }
                  }
                  uVar20 = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
                  if ((int)_h < 1) {
                    lVar4 = local_328.cstep * local_4e8 * uVar20;
                  }
                  else {
                    lVar4 = (long)local_328.w;
                    pvVar22 = (void *)((long)local_328.data + local_328.cstep * uVar20 * local_4e8);
                    uVar8 = 0;
                    do {
                      if (0 < (int)_h_00) {
                        uVar6 = 0;
                        fVar24 = -3.4028235e+38;
                        do {
                          fVar25 = *(float *)((long)pvVar22 + uVar6 * 4);
                          if (fVar24 <= fVar25) {
                            fVar24 = fVar25;
                          }
                          uVar6 = uVar6 + 1;
                        } while (uVar7 != uVar6);
                        if (0 < (int)_h_00) {
                          fVar25 = 0.0;
                          uVar6 = 0;
                          do {
                            fVar23 = expf(*(float *)((long)pvVar22 + uVar6 * 4) - fVar24);
                            *(float *)((long)pvVar22 + uVar6 * 4) = fVar23;
                            fVar25 = fVar25 + fVar23;
                            uVar6 = uVar6 + 1;
                          } while (uVar7 != uVar6);
                          if (0 < (int)_h_00) {
                            uVar6 = 0;
                            do {
                              *(float *)((long)pvVar22 + uVar6 * 4) =
                                   *(float *)((long)pvVar22 + uVar6 * 4) * (1.0 / fVar25);
                              uVar6 = uVar6 + 1;
                            } while (uVar7 != uVar6);
                          }
                        }
                      }
                      uVar8 = uVar8 + 1;
                      pvVar22 = (void *)((long)pvVar22 + lVar4 * uVar20);
                    } while (uVar8 != uVar17);
                    uVar20 = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
                    lVar4 = local_328.cstep * local_4e8 * uVar20;
                  }
                  local_4a8.data = (void *)(lVar4 + (long)local_328.data);
                  local_4a8.refcount._0_4_ = 0;
                  local_4a8.refcount._4_4_ = 0;
                  local_4a8.elemsize._0_4_ = (undefined4)uVar20;
                  local_4a8.elemsize._4_4_ = (undefined4)(uVar20 >> 0x20);
                  local_4a8.elempack = local_328.elempack;
                  local_4a8.allocator = local_328.allocator;
                  local_4a8.w = local_328.w;
                  local_4a8.h = local_328.h;
                  local_4a8.c = local_328.d;
                  local_4a8.d = 1;
                  local_4a8.dims = local_328.dims + -1;
                  local_4a8.cstep =
                       (uVar20 * (long)local_328.w * (long)local_328.h + 0xf & 0xfffffffffffffff0) /
                       uVar20;
                  if (local_328.dims == 4) {
                    local_4a8.cstep = (long)local_328.w * (long)local_328.h;
                  }
                  uVar20 = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                  local_438.data =
                       (void *)(local_148.cstep * local_4e8 * uVar20 + (long)local_148.data);
                  local_438.refcount._0_4_ = 0;
                  local_438.refcount._4_4_ = 0;
                  local_438.elemsize._0_4_ = (undefined4)local_148.elemsize;
                  local_438.elemsize._4_4_ = local_148.elemsize._4_4_;
                  local_438.elempack = local_148.elempack;
                  local_438.allocator = local_148.allocator;
                  local_438.w = local_148.w;
                  local_438.h = local_148.h;
                  local_438.c = local_148.d;
                  local_438.d = 1;
                  local_438.dims = local_148.dims + -1;
                  local_438.cstep =
                       (uVar20 * (long)local_148.h * (long)local_148.w + 0xf & 0xfffffffffffffff0) /
                       uVar20;
                  if (local_148.dims == 4) {
                    local_438.cstep = (long)local_148.h * (long)local_148.w;
                  }
                  local_288.cstep = 0;
                  local_288.data = (void *)0x0;
                  local_288.refcount._0_4_ = 0;
                  local_288.refcount._4_4_ = 0;
                  local_288.elemsize._0_4_ = 0;
                  local_288.elemsize._4_4_ = 0;
                  local_288.elempack = 0;
                  local_288.h = 0;
                  local_288.d = 0;
                  local_288.c = 0;
                  local_288.allocator = (Allocator *)0x0;
                  local_288.dims = 0;
                  local_288.w = 0;
                  local_1e8.cstep = 0;
                  local_1e8.data = (void *)0x0;
                  local_1e8.refcount._0_4_ = 0;
                  local_1e8.refcount._4_4_ = 0;
                  local_1e8.elemsize._0_4_ = 0;
                  local_1e8._20_8_ = 0;
                  local_1e8.h = 0;
                  local_1e8.d = 0;
                  local_1e8.c = 0;
                  local_1e8.allocator = (Allocator *)0x0;
                  local_1e8.dims = 0;
                  local_1e8.w = 0;
                  dynamic_quantize_2d_per_h(&local_4a8,&local_288,&local_1e8,opt);
                  local_2d8.cstep = 0;
                  local_2d8.data = (void *)0x0;
                  local_2d8.refcount._0_4_ = 0;
                  local_2d8.refcount._4_4_ = 0;
                  local_2d8.elemsize._0_4_ = 0;
                  local_2d8.elemsize._4_4_ = 0;
                  local_2d8.elempack = 0;
                  local_2d8.h = 0;
                  local_2d8.d = 0;
                  local_2d8.c = 0;
                  local_2d8.allocator = (Allocator *)0x0;
                  local_2d8.dims = 0;
                  local_2d8.w = 0;
                  dynamic_quantize_2d(&local_438,&local_2d8,&local_4c0,
                                      (Option *)opt->workspace_allocator);
                  if (0 < (int)_h) {
                    uVar20 = 0;
                    pvVar22 = local_288.data;
                    do {
                      if (0 < (int)_w) {
                        fVar24 = *(float *)((long)local_1e8.data + uVar20 * 4);
                        uVar8 = 0;
                        pvVar10 = local_2d8.data;
                        do {
                          if ((int)_h_00 < 1) {
                            fVar25 = 0.0;
                          }
                          else {
                            lVar4 = 0;
                            iVar2 = 0;
                            do {
                              iVar2 = iVar2 + (int)*(char *)((long)pvVar10 + lVar4) *
                                              (int)*(char *)((long)pvVar22 + lVar4);
                              lVar4 = lVar4 + 1;
                            } while (_h_00 != (uint)lVar4);
                            fVar25 = (float)iVar2;
                          }
                          *(float *)((long)local_198.data +
                                    uVar8 * 4 +
                                    local_198.cstep *
                                    CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize
                                            ) * uVar20 +
                                    local_198.w * local_4e8 *
                                    CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize
                                            )) = fVar25 * (1.0 / (fVar24 * local_4c0));
                          uVar8 = uVar8 + 1;
                          pvVar10 = (void *)((long)pvVar10 +
                                            (long)local_2d8.w *
                                            CONCAT44(local_2d8.elemsize._4_4_,
                                                     (undefined4)local_2d8.elemsize));
                        } while (uVar8 != uVar16);
                      }
                      uVar20 = uVar20 + 1;
                      pvVar22 = (void *)((long)pvVar22 +
                                        (long)local_288.w *
                                        CONCAT44(local_288.elemsize._4_4_,
                                                 (undefined4)local_288.elemsize));
                    } while (uVar20 != uVar17);
                  }
                  piVar5 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_2d8.allocator == (Allocator *)0x0) {
                        if (local_2d8.data != (void *)0x0) {
                          free(local_2d8.data);
                        }
                      }
                      else {
                        (*(local_2d8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_1e8.allocator == (Allocator *)0x0) {
                        if (local_1e8.data != (void *)0x0) {
                          free(local_1e8.data);
                        }
                      }
                      else {
                        (*(local_1e8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_288.allocator == (Allocator *)0x0) {
                        if (local_288.data != (void *)0x0) {
                          free(local_288.data);
                        }
                      }
                      else {
                        (*(local_288.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_438.refcount._4_4_,local_438.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_438.allocator == (Allocator *)0x0) {
                        if (local_438.data != (void *)0x0) {
                          free(local_438.data);
                        }
                      }
                      else {
                        (*(local_438.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar5 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_4a8.allocator == (Allocator *)0x0) {
                        if (local_4a8.data != (void *)0x0) {
                          free(local_4a8.data);
                        }
                      }
                      else {
                        (*(local_4a8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_4e8 = local_4e8 + 1;
                  local_388 = local_388 + local_58;
                  local_3e8 = local_3e8 + local_3f0;
                } while (local_4e8 < this->num_heads);
              }
              local_4a8.cstep = 0;
              local_4a8.data = (void *)0x0;
              local_4a8.refcount._0_4_ = 0;
              local_4a8.refcount._4_4_ = 0;
              local_4a8.elemsize._0_4_ = 0;
              local_4a8.elemsize._4_4_ = 0;
              local_4a8.elempack = 0;
              local_4a8.allocator = (Allocator *)0x0;
              local_4a8.dims = 0;
              local_4a8.w = 0;
              local_4a8.h = 0;
              local_4a8.d = 0;
              local_4a8.c = 0;
              local_438.cstep = 0;
              local_438.data = (void *)0x0;
              local_438.refcount._0_4_ = 0;
              local_438.refcount._4_4_ = 0;
              local_438.elemsize._0_4_ = 0;
              local_438.elemsize._4_4_ = 0;
              local_438.elempack = 0;
              local_438.allocator = (Allocator *)0x0;
              local_438.dims = 0;
              local_438.w = 0;
              local_438.h = 0;
              local_438.d = 0;
              local_438.c = 0;
              Mat::create(&local_4a8,local_198.w,local_198.h,local_198.c,1,1,
                          opt->workspace_allocator);
              Mat::create(&local_438,_h,4,1,opt->workspace_allocator);
              uVar7 = (ulong)local_4a8.c;
              if (0 < (long)uVar7) {
                uVar16 = 0;
                pvVar22 = local_198.data;
                do {
                  fVar24 = 0.0;
                  if (0 < local_4a8.h * local_4a8.w) {
                    uVar20 = 0;
                    do {
                      fVar25 = ABS(*(float *)((long)pvVar22 + uVar20 * 4));
                      if (fVar24 <= fVar25) {
                        fVar24 = fVar25;
                      }
                      uVar20 = uVar20 + 1;
                    } while ((uint)(local_4a8.h * local_4a8.w) != uVar20);
                  }
                  *(uint *)((long)local_438.data + uVar16 * 4) =
                       -(uint)(fVar24 == 0.0) & 0x3f800000 |
                       ~-(uint)(fVar24 == 0.0) & (uint)(127.0 / fVar24);
                  uVar16 = uVar16 + 1;
                  pvVar22 = (void *)((long)pvVar22 +
                                    local_198.cstep *
                                    CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize
                                            ));
                } while (uVar16 != uVar7);
                if (0 < local_4a8.c) {
                  lVar4 = 0;
                  iVar2 = local_4a8.w;
                  iVar15 = local_4a8.h;
                  do {
                    pvVar10 = local_198.data;
                    pvVar22 = local_4a8.data;
                    if (0 < iVar15 * iVar2) {
                      lVar14 = CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize) *
                               local_4a8.cstep;
                      lVar13 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) *
                               local_198.cstep;
                      lVar21 = 0;
                      do {
                        fVar24 = roundf(*(float *)((long)local_438.data + lVar4 * 4) *
                                        *(float *)((long)pvVar10 + lVar21 * 4 + lVar13 * lVar4));
                        iVar2 = (int)fVar24;
                        if (iVar2 < -0x7e) {
                          iVar2 = -0x7f;
                        }
                        if (0x7e < iVar2) {
                          iVar2 = 0x7f;
                        }
                        *(char *)((long)pvVar22 + lVar21 + lVar14 * lVar4) = (char)iVar2;
                        lVar21 = lVar21 + 1;
                      } while (lVar21 < local_4a8.h * local_4a8.w);
                      uVar7 = (ulong)local_4a8._52_8_ >> 0x20;
                      iVar2 = local_4a8.w;
                      iVar15 = local_4a8.h;
                    }
                    lVar4 = lVar4 + 1;
                  } while (lVar4 < (int)uVar7);
                }
              }
              if (0 < (int)_h) {
                pvVar22 = local_60->data;
                iVar2 = local_60->w;
                sVar1 = local_60->elemsize;
                pvVar10 = (this->out_weight_data).data;
                iVar15 = this->embed_dim;
                pvVar18 = (this->out_bias_data).data;
                uVar7 = 0;
                pvVar11 = local_4a8.data;
                do {
                  if (0 < (int)_w_00) {
                    uVar16 = 0;
                    pvVar12 = pvVar10;
                    do {
                      if (iVar15 < 1) {
                        fVar24 = 0.0;
                      }
                      else {
                        lVar4 = 0;
                        iVar3 = 0;
                        do {
                          iVar3 = iVar3 + (int)*(char *)((long)pvVar12 + lVar4) *
                                          (int)*(char *)((long)pvVar11 + lVar4);
                          lVar4 = lVar4 + 1;
                        } while (iVar15 != (int)lVar4);
                        fVar24 = (float)iVar3;
                      }
                      *(float *)((long)pvVar22 + uVar16 * 4 + (long)iVar2 * sVar1 * uVar7) =
                           fVar24 / (*(float *)((long)local_438.data + uVar7 * 4) *
                                    this->out_weight_data_int8_scale) +
                           *(float *)((long)pvVar18 + uVar16 * 4);
                      uVar16 = uVar16 + 1;
                      pvVar12 = (void *)((long)pvVar12 + (long)iVar15);
                    } while (uVar16 != _w_00);
                  }
                  uVar7 = uVar7 + 1;
                  pvVar11 = (void *)((long)pvVar11 +
                                    local_4a8.cstep *
                                    CONCAT44(local_4a8.elemsize._4_4_,(undefined4)local_4a8.elemsize
                                            ));
                } while (uVar7 != uVar17);
              }
              piVar5 = (int *)CONCAT44(local_438.refcount._4_4_,local_438.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_438.allocator == (Allocator *)0x0) {
                    if (local_438.data != (void *)0x0) {
                      free(local_438.data);
                    }
                  }
                  else {
                    (*(local_438.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(local_4a8.refcount._4_4_,local_4a8.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_4a8.allocator == (Allocator *)0x0) {
                    if (local_4a8.data != (void *)0x0) {
                      free(local_4a8.data);
                    }
                  }
                  else {
                    (*(local_4a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(local_3d8.refcount._4_4_,local_3d8.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_3d8.allocator == (Allocator *)0x0) {
                    if (local_3d8.data != (void *)0x0) {
                      free(local_3d8.data);
                    }
                  }
                  else {
                    (*(local_3d8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    if (local_378.data != (void *)0x0) {
                      free(local_378.data);
                    }
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_238.allocator == (Allocator *)0x0) {
                    if (local_238.data != (void *)0x0) {
                      free(local_238.data);
                    }
                  }
                  else {
                    (*(local_238.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar15 = 0;
            }
            piVar5 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  if (local_198.data != (void *)0x0) {
                    free(local_198.data);
                  }
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_328.allocator == (Allocator *)0x0) {
                if (local_328.data != (void *)0x0) {
                  free(local_328.data);
                }
              }
              else {
                (*(local_328.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_148.allocator == (Allocator *)0x0) {
              if (local_148.data != (void *)0x0) {
                free(local_148.data);
              }
            }
            else {
              (*(local_148.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            if (local_a8.data != (void *)0x0) {
              free(local_a8.data);
            }
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (local_4b0 != (int *)0x0) {
    LOCK();
    *local_4b0 = *local_4b0 + -1;
    UNLOCK();
    if (*local_4b0 == 0) {
      if (local_458 == (long *)0x0) {
        if (local_4d0 != (void *)0x0) {
          free(local_4d0);
        }
      }
      else {
        (**(code **)(*local_458 + 0x18))(local_458,local_4d0);
      }
    }
  }
  return iVar15;
}

Assistant:

int MultiHeadAttention::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;
    const int qdim = weight_data_size / embed_dim;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(qdim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xq.empty())
        return -100;
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xk.empty())
        return -100;
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);
    if (xv.empty())
        return -100;

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xqk.empty())
        return -100;

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);
    if (xqkv.empty())
        return -100;

    // dynamic quantize q_blob
    Mat q_blob_int8;
    float q_blob_int8_scale;
    dynamic_quantize_2d(q_blob, q_blob_int8, q_blob_int8_scale, opt);

    // dynamic quantize k_blob
    Mat k_blob_int8;
    float k_blob_int8_scale;
    if (bottom_blobs.size() == 1)
    {
        k_blob_int8 = q_blob_int8;
        k_blob_int8_scale = q_blob_int8_scale;
    }
    else
    {
        dynamic_quantize_2d(k_blob, k_blob_int8, k_blob_int8_scale, opt);
    }

    // dynamic quantize v_blob
    Mat v_blob_int8;
    float v_blob_int8_scale;
    if (bottom_blobs.size() == 1)
    {
        v_blob_int8 = q_blob_int8;
        v_blob_int8_scale = q_blob_int8_scale;
    }
    else if (bottom_blobs.size() == 2)
    {
        v_blob_int8 = k_blob_int8;
        v_blob_int8_scale = k_blob_int8_scale;
    }
    else
    {
        dynamic_quantize_2d(v_blob, v_blob_int8, v_blob_int8_scale, opt);
    }

    // NCNN_LOGE("%.4f %.4f", q_weight_data_int8_scale, q_blob_int8_scale);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * scale
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* ptr = q_blob_int8.row<const signed char>(i);
                    const signed char* kptr = (const signed char*)q_weight_data + qdim * (q * embed_dim_per_head + j);

                    int sum = 0;
                    for (int k = 0; k < qdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float q_descale = 1.f / (q_weight_data_int8_scales[q * embed_dim_per_head + j] * q_blob_int8_scale);
                    float sum_fp32 = sum * q_descale + q_bias_data[q * embed_dim_per_head + j];

                    outptr[j] = sum_fp32 * scale;
                }
            }
        }

        // xk = affine(k)
        {
            float* outptr = xk.channel(q);

            for (int i = 0; i < k_blob_int8.h; i++)
            {
                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* ptr = k_blob_int8.row<const signed char>(i);
                    const signed char* kptr = (const signed char*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    int sum = 0;
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float k_descale = 1.f / (k_weight_data_int8_scales[q * embed_dim_per_head + j] * k_blob_int8_scale);
                    float sum_fp32 = sum * k_descale + k_bias_data[q * embed_dim_per_head + j];

                    *outptr++ = sum_fp32;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < v_blob_int8.h; j++)
                {
                    const signed char* ptr = v_blob_int8.row<const signed char>(j);
                    const signed char* kptr = (const signed char*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    int sum = 0;
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float v_descale = 1.f / (v_weight_data_int8_scales[q * embed_dim_per_head + i] * v_blob_int8_scale);
                    float sum_fp32 = sum * v_descale + v_bias_data[q * embed_dim_per_head + i];

                    *outptr++ = sum_fp32;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            // dynamic quantize xqm per h
            Mat xqm_int8;
            Mat xqm_int8_scales;
            dynamic_quantize_2d_per_h(xqm, xqm_int8, xqm_int8_scales, opt);

            // dynamic quantize xkm
            Mat xkm_int8;
            float xkm_int8_scale;
            dynamic_quantize_2d(xkm, xkm_int8, xkm_int8_scale, opt);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);
                const float xqk_descale = 1.f / (xqm_int8_scales[i] * xkm_int8_scale);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const signed char* qptr = xqm_int8.row<const signed char>(i);
                    const signed char* kptr = xkm_int8.row<const signed char>(j);

                    int sum = 0;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }
                    float sum_fp32 = sum * xqk_descale;

                    outptr[j] = sum_fp32;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            // dynamic quantize xqkm
            Mat xqkm_int8;
            Mat xqkm_int8_scales;
            dynamic_quantize_2d_per_h(xqkm, xqkm_int8, xqkm_int8_scales, opt);

            // dynamic quantize xvm per h
            Mat xvm_int8;
            float xvm_int8_scale;
            dynamic_quantize_2d(xvm, xvm_int8, xvm_int8_scale, opt);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);
                const float xqkv_descale = 1.f / (xqkm_int8_scales[i] * xvm_int8_scale);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* qkptr = xqkm_int8.row<const signed char>(i);
                    const signed char* vptr = xvm_int8.row<const signed char>(j);

                    int sum = 0;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }
                    float sum_fp32 = sum * xqkv_descale;

                    outptr[j] = sum_fp32;
                }
            }
        }
    }

    // dynamic quantize xqkv
    Mat xqkv_int8;
    Mat xqkv_int8_scales;
    {
        xqkv_int8.create(xqkv.w, xqkv.h, xqkv.c, (size_t)1u, 1, opt.workspace_allocator);
        xqkv_int8_scales.create(src_seqlen, (size_t)4u, 1, opt.workspace_allocator);

        for (int i = 0; i < xqkv_int8.c; i++)
        {
            const float* ptr = xqkv.channel(i);

            float absmax = 0.f;
            for (int j = 0; j < xqkv_int8.w * xqkv_int8.h; j++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[j]));
            }

            xqkv_int8_scales[i] = absmax == 0.f ? 1.f : 127.f / absmax;
        }

        for (int i = 0; i < xqkv_int8.c; i++)
        {
            const float* ptr = xqkv.channel(i);
            signed char* outptr = xqkv_int8.channel(i);

            for (int j = 0; j < xqkv_int8.w * xqkv_int8.h; j++)
            {
                outptr[j] = float2int8(ptr[j] * xqkv_int8_scales[i]);
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < qdim; j++)
        {
            const signed char* ptr = xqkv_int8.channel(i);
            const signed char* kptr = (const signed char*)out_weight_data + embed_dim * j;

            int sum = 0;
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }
            const float out_descale = 1.f / (out_weight_data_int8_scale * xqkv_int8_scales[i]);
            float sum_fp32 = sum * out_descale + out_bias_data[j];

            outptr[j] = sum_fp32;
        }
    }

    return 0;
}